

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

Roaring64Map *
roaring::Roaring64Map::portableDeserializeFrozen(Roaring64Map *__return_storage_ptr__,char *buf)

{
  _Rb_tree_header *p_Var1;
  uint32_t key;
  size_t sVar2;
  long lVar3;
  uint32_t *puVar4;
  bool bVar5;
  Roaring read_var;
  
  p_Var1 = &(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header =
       0;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->roarings)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->copyOnWrite = false;
  lVar3 = *(long *)buf;
  puVar4 = (uint32_t *)(buf + 8);
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    key = *puVar4;
    Roaring::portableDeserializeFrozen(&read_var,(char *)(puVar4 + 1));
    sVar2 = Roaring::getSizeInBytes(&read_var,true);
    emplaceOrInsert(__return_storage_ptr__,key,&read_var);
    puVar4 = (uint32_t *)((long)(puVar4 + 1) + sVar2);
    Roaring::~Roaring(&read_var);
  }
  return __return_storage_ptr__;
}

Assistant:

static const Roaring64Map portableDeserializeFrozen(const char *buf) {
        Roaring64Map result;
        // get map size
        uint64_t map_size;
        std::memcpy(&map_size, buf, sizeof(uint64_t));
        buf += sizeof(uint64_t);
        for (uint64_t lcv = 0; lcv < map_size; lcv++) {
            // get map key
            uint32_t key;
            std::memcpy(&key, buf, sizeof(uint32_t));
            buf += sizeof(uint32_t);
            // read map value Roaring
            Roaring read_var = Roaring::portableDeserializeFrozen(buf);
            // forward buffer past the last Roaring bitmap
            buf += read_var.getSizeInBytes(true);
            result.emplaceOrInsert(key, std::move(read_var));
        }
        return result;
    }